

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

MDHelper *
MetricsDiscovery::MDHelper::CreateEBS
          (string *metricsLibraryName,string *metricSetSymbolName,string *metricsFileName,
          uint32_t adapterIndex,bool includeMaxValues)

{
  bool bVar1;
  MDHelper *this;
  MDHelper *pMDHelper;
  
  this = (MDHelper *)operator_new(0x78);
  MDHelper(this,0x60);
  pMDHelper = this;
  bVar1 = InitMetricsDiscovery
                    (this,metricsLibraryName,metricSetSymbolName,metricsFileName,adapterIndex,
                     includeMaxValues);
  if (!bVar1) {
    Delete(&pMDHelper);
    this = pMDHelper;
  }
  return this;
}

Assistant:

MDHelper* MDHelper::CreateEBS(
    const std::string& metricsLibraryName,
    const std::string& metricSetSymbolName,
    const std::string& metricsFileName,
    uint32_t adapterIndex,
    bool includeMaxValues )
{
#if defined(__linux__) || defined(__FreeBSD__)
    // This is a temporary workaround until the Linux MDAPI is updated
    // to expose metrics for OpenCL.
    MDHelper*   pMDHelper = new MDHelper(API_TYPE_OCL|API_TYPE_OGL4_X);
#else
    MDHelper*   pMDHelper = new MDHelper(API_TYPE_OCL);
#endif
    if( pMDHelper )
    {
        if( pMDHelper->InitMetricsDiscovery(
                metricsLibraryName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues ) == false )
        {
            Delete( pMDHelper );
        }
    }
    return pMDHelper;
}